

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O2

int mod2dense_forcibly_invert(mod2dense *m,mod2dense *r,int *a_row,int *a_col)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  mod2word *pmVar4;
  mod2word *pmVar5;
  mod2word **ppmVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  char *__ptr;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  size_t sStack_70;
  
  uVar2 = m->n_rows;
  if (uVar2 == m->n_cols) {
    if (r == m) {
      __ptr = "mod2dense_forcibly_invert: Result matrix is the same as the operand\n";
      sStack_70 = 0x44;
    }
    else {
      if ((r->n_rows == uVar2) && (r->n_cols == uVar2)) {
        uVar3 = m->n_words;
        mod2dense_clear(r);
        uVar9 = 0;
        iVar13 = 0;
        if (0 < (int)uVar2) {
          uVar9 = (ulong)uVar2;
          iVar13 = 0;
        }
        for (; (int)uVar9 != iVar13; iVar13 = iVar13 + 1) {
          mod2dense_set(r,iVar13,iVar13,1);
        }
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          a_row[uVar7] = -1;
          a_col[uVar7] = (int)uVar7;
        }
        uVar7 = 0;
        uVar14 = 0;
        if (0 < (int)uVar3) {
          uVar14 = (ulong)uVar3;
        }
        do {
          if (uVar7 == uVar9) {
            iVar13 = 0;
            for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
              if (a_row[uVar7] != -1) {
                a_row[iVar13] = a_row[uVar7];
                a_col[iVar13] = a_col[uVar7];
                iVar13 = iVar13 + 1;
              }
            }
            return iVar13;
          }
          iVar13 = (int)uVar7;
          uVar10 = uVar7 >> 5 & 0x7ffffff;
          uVar12 = 1 << ((byte)uVar7 & 0x1f);
          for (uVar8 = uVar7; uVar2 != uVar8; uVar8 = uVar8 + 1) {
            if ((m->col[uVar8][uVar10] & uVar12) != 0) {
              if (uVar2 != (uint)uVar8) {
                uVar8 = uVar8 & 0xffffffff;
                if (uVar7 != uVar8) {
                  ppmVar6 = m->col;
                  pmVar4 = ppmVar6[uVar7];
                  ppmVar6[uVar7] = ppmVar6[uVar8];
                  m->col[uVar8] = pmVar4;
                  ppmVar6 = r->col;
                  pmVar4 = ppmVar6[uVar7];
                  ppmVar6[uVar7] = ppmVar6[uVar8];
                  r->col[uVar8] = pmVar4;
                  iVar13 = a_col[uVar7];
                  a_col[uVar7] = a_col[uVar8];
                  a_col[uVar8] = iVar13;
                }
                goto LAB_00127220;
              }
              break;
            }
          }
          mod2dense_set(m,iVar13,iVar13,1);
          a_row[uVar7] = iVar13;
LAB_00127220:
          for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
            if (uVar8 != uVar7) {
              pmVar4 = m->col[uVar8];
              if ((pmVar4[uVar10] & uVar12) != 0) {
                pmVar5 = m->col[uVar7];
                for (uVar11 = uVar7 >> 5; (long)uVar11 < (long)(int)uVar3; uVar11 = uVar11 + 1) {
                  puVar1 = pmVar4 + uVar11;
                  *puVar1 = *puVar1 ^ pmVar5[uVar11];
                }
                pmVar4 = r->col[uVar8];
                pmVar5 = r->col[uVar7];
                for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
                  puVar1 = pmVar4 + uVar11;
                  *puVar1 = *puVar1 ^ pmVar5[uVar11];
                }
              }
            }
          }
          uVar7 = uVar7 + 1;
        } while( true );
      }
      __ptr = "mod2dense_forcibly_invert: Matrix to receive inverse has wrong dimensions\n";
      sStack_70 = 0x4a;
    }
  }
  else {
    __ptr = "mod2dense_forcibly_invert: Matrix to invert is not square\n";
    sStack_70 = 0x3a;
  }
  fwrite(__ptr,sStack_70,1,_stderr);
  exit(1);
}

Assistant:

int mod2dense_forcibly_invert 
( mod2dense *m, 	/* The matrix to find the inverse of (destroyed) */
  mod2dense *r,		/* Place to store the inverse */
  int *a_row,		/* Place to store row indexes of altered elements */
  int *a_col		/* Place to store column indexes of altered elements */
)
{
  mod2word *s, *t;
  int i, j, k, n, w, k0, b0;
  int u, c;

  if (mod2dense_rows(m)!=mod2dense_cols(m))
  { fprintf(stderr,
      "mod2dense_forcibly_invert: Matrix to invert is not square\n");
    exit(1);
  }

  if (r==m)
  { fprintf(stderr, 
      "mod2dense_forcibly_invert: Result matrix is the same as the operand\n");
    exit(1);
  }

  n = mod2dense_rows(m);
  w = m->n_words;

  if (mod2dense_rows(r)!=n || mod2dense_cols(r)!=n)
  { fprintf(stderr,
 "mod2dense_forcibly_invert: Matrix to receive inverse has wrong dimensions\n");
    exit(1);
  }

  mod2dense_clear(r);
  for (i = 0; i<n; i++) 
  { mod2dense_set(r,i,i,1);
  }

  for (i = 0; i<n; i++)
  { a_row[i] = -1;
    a_col[i] = i;
  }

  for (i = 0; i<n; i++)
  { 
    k0 = i >> mod2_wordsize_shift;
    b0 = i & mod2_wordsize_mask;

    for (j = i; j<n; j++) 
    { if (mod2_getbit(m->col[j][k0],b0)) break;
    }

    if (j==n)
    { j = i;
      mod2dense_set(m,i,j,1);
      a_row[i] = i;
    }

    if (j!=i)
    { 
      t = m->col[i];
      m->col[i] = m->col[j];
      m->col[j] = t;

      t = r->col[i];
      r->col[i] = r->col[j];
      r->col[j] = t;

      u = a_col[i];
      a_col[i] = a_col[j];
      a_col[j] = u;
    }

    for (j = 0; j<n; j++)
    { if (j!=i && mod2_getbit(m->col[j][k0],b0))
      { s = m->col[j];
        t = m->col[i];
        for (k = k0; k<w; k++) s[k] ^= t[k];
        s = r->col[j];
        t = r->col[i];
        for (k = 0; k<w; k++) s[k] ^= t[k];
      }
    }
  }

  c = 0;
  for (i = 0; i<n; i++)
  { if (a_row[i]!=-1)
    { a_row[c] = a_row[i];
      a_col[c] = a_col[i];
      c += 1;
    }
  }

  return c;
}